

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_fusearef(ASMState *as,IRIns *ir,RegSet allow)

{
  char cVar1;
  ushort uVar2;
  IRIns *pIVar3;
  byte bVar4;
  uint8_t uVar5;
  uint uVar6;
  ulong uVar7;
  Reg RVar8;
  IRIns *ir_1;
  ushort uVar9;
  long lVar10;
  IRRef2 IVar11;
  uint uVar12;
  
  uVar9 = (ir->field_0).op1;
  uVar7 = (ulong)uVar9;
  pIVar3 = as->ir;
  (as->mrm).ofs = 0;
  cVar1 = *(char *)((long)pIVar3 + uVar7 * 8 + 5);
  if (cVar1 == ')') {
    lVar10 = (long)*(short *)((long)pIVar3 + uVar7 * 8 + 2);
    if (-1 < lVar10) {
      IVar11 = pIVar3[lVar10].field_1.op12;
LAB_00143319:
      (as->mrm).ofs = IVar11;
      uVar9 = pIVar3[uVar7].field_0.op1;
      uVar7 = (ulong)uVar9;
    }
  }
  else if (cVar1 == 'E') {
    uVar2 = pIVar3[uVar7].field_0.op1;
    if ((((*(char *)((long)pIVar3 + (ulong)uVar2 * 8 + 5) == 'Q') &&
         (pIVar3[uVar2].field_0.op1 < 0x11)) && (as->fuseref != 0xffffffff)) &&
       (uVar12 = as->curins, uVar12 <= uVar2 + 0x1f)) {
      IVar11 = 0x40;
      do {
        uVar12 = uVar12 - 1;
        if (uVar12 <= uVar2) goto LAB_00143319;
      } while (*(char *)((long)pIVar3 + (ulong)uVar12 * 8 + 5) != ';');
    }
  }
  cVar1 = *(char *)((long)pIVar3 + uVar7 * 8 + 6);
  RVar8 = (Reg)cVar1;
  if (cVar1 < '\0') {
    RVar8 = ra_allocref(as,(uint)uVar9,allow);
  }
  bVar4 = (byte)RVar8 & 0x1f;
  uVar12 = as->weakset & ~(1 << (RVar8 & 0x1f));
  as->weakset = uVar12;
  (as->mrm).base = (byte)RVar8;
  if ((long)(short)(ir->field_0).op2 < 0) {
    (as->mrm).scale = 0xc0;
    cVar1 = *(char *)((long)as->ir + (ulong)(ir->field_0).op2 * 8 + 6);
    uVar6 = (uint)cVar1;
    if (cVar1 < '\0') {
      uVar6 = ra_allocref(as,(uint)(ir->field_0).op2,
                          (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4) & allow);
      uVar12 = as->weakset;
    }
    uVar5 = (uint8_t)uVar6;
    as->weakset = uVar12 & ~(1 << (uVar6 & 0x1f));
  }
  else {
    (as->mrm).ofs = (as->mrm).ofs + as->ir[(short)(ir->field_0).op2].field_1.op12 * 8;
    uVar5 = 0x80;
  }
  (as->mrm).idx = uVar5;
  return;
}

Assistant:

static void asm_fusearef(ASMState *as, IRIns *ir, RegSet allow)
{
  IRIns *irx;
  lj_assertA(ir->o == IR_AREF, "expected AREF");
  as->mrm.base = (uint8_t)ra_alloc1(as, asm_fuseabase(as, ir->op1), allow);
  irx = IR(ir->op2);
  if (irref_isk(ir->op2)) {
    as->mrm.ofs += 8*irx->i;
    as->mrm.idx = RID_NONE;
  } else {
    rset_clear(allow, as->mrm.base);
    as->mrm.scale = XM_SCALE8;
    /* Fuse a constant ADD (e.g. t[i+1]) into the offset.
    ** Doesn't help much without ABCelim, but reduces register pressure.
    */
    if (!LJ_64 &&  /* Has bad effects with negative index on x64. */
	mayfuse(as, ir->op2) && ra_noreg(irx->r) &&
	irx->o == IR_ADD && irref_isk(irx->op2)) {
      as->mrm.ofs += 8*IR(irx->op2)->i;
      as->mrm.idx = (uint8_t)ra_alloc1(as, irx->op1, allow);
    } else {
      as->mrm.idx = (uint8_t)ra_alloc1(as, ir->op2, allow);
    }
  }
}